

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.cpp
# Opt level: O0

size_t duckdb_brotli::BrotliZopfliComputeShortestPath
                 (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
                 size_t ringbuffer_mask,ContextLut literal_context_lut,BrotliEncoderParams *params,
                 int *dist_cache,Hasher *hasher,ZopfliNode *nodes)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  uint32_t uVar9;
  int iVar10;
  uint uVar11;
  ZopfliCostModel *pZVar12;
  BackwardMatch *dst;
  ulong *puVar13;
  long lVar14;
  ZopfliCostModel *pZVar15;
  ZopfliCostModel *pZVar16;
  ulong uVar17;
  ZopfliCostModel *pZVar18;
  BrotliEncoderDictionary *pBVar19;
  ulong uVar20;
  ulong uVar21;
  StartPosQueue *queue_00;
  ZopfliCostModel *pZVar22;
  long lVar23;
  size_t sVar24;
  ZopfliCostModel *in_RCX;
  int *in_RDX;
  ulong *puVar25;
  ulong *puVar26;
  ulong in_RSI;
  BrotliEncoderDictionary *pBVar27;
  BackwardMatch *in_R8;
  long in_R9;
  bool bVar28;
  bool bVar29;
  long in_stack_00000008;
  MemoryManager *in_stack_00000010;
  long in_stack_00000018;
  MemoryManager *in_stack_00000020;
  size_t cd_matches;
  uint8_t p2;
  uint8_t p1;
  int dict_id;
  size_t num_matches;
  size_t skip;
  size_t dictionary_start;
  size_t max_distance;
  size_t pos;
  ZopfliCostModel *model;
  size_t lz_matches_offset;
  size_t gap;
  CompoundDictionary *addon;
  size_t i;
  size_t store_end;
  BackwardMatch *matches;
  StartPosQueue queue;
  size_t max_zopfli_len;
  size_t max_backward_limit;
  size_t stream_offset;
  size_t distance;
  uint32_t dict_id_1;
  size_t l;
  size_t maxlen;
  size_t minlen;
  size_t len;
  size_t backward;
  size_t prev_ix;
  size_t i_1;
  uint32_t dict_matches [38];
  size_t stop;
  size_t short_match_max_backward;
  size_t best_len;
  size_t cur_ix_masked;
  BackwardMatch *orig_matches;
  size_t total_found;
  size_t d;
  size_t base_offset;
  size_t j;
  size_t i_2;
  size_t matching_bits;
  uint64_t x;
  uint8_t *s1_orig;
  size_t len_1;
  size_t cur_len;
  size_t prev_ix_masked;
  size_t backward_1;
  size_t depth_remaining;
  size_t best_len_right;
  size_t best_len_left;
  size_t node_right;
  size_t node_left;
  size_t prev_ix_1;
  uint32_t *forest;
  uint32_t *buckets;
  uint32_t key;
  int should_reroot_tree;
  size_t max_comp_len;
  size_t cur_ix_masked_1;
  size_t matching_bits_1;
  uint64_t x_1;
  uint8_t *s1_orig_1;
  uint64_t t_3;
  uint64_t t_2;
  uint64_t t_1;
  uint64_t t;
  size_t len_2;
  size_t limit;
  size_t distance_1;
  size_t offset;
  void *tail;
  size_t found;
  uint32_t item;
  uint32_t *chain;
  uint32_t head;
  uint32_t slot;
  uint32_t key_1;
  uint64_t h;
  size_t best_len_1;
  size_t cur_ix_masked_2;
  uint8_t *source;
  uint32_t *items;
  uint16_t *heads;
  uint32_t *slot_offsets;
  uint64_t hash_mask;
  uint32_t slot_mask;
  uint32_t hash_shift;
  uint32_t slot_bits;
  uint32_t bucket_bits;
  uint32_t hash_bits;
  uint32_t source_size;
  size_t matching_bits_2;
  uint64_t x_2;
  uint8_t *s1_orig_2;
  uint64_t t_6;
  uint64_t t_5;
  uint64_t t_4;
  void *v;
  size_t max_backward;
  size_t len_3;
  size_t cur_len_1;
  size_t prev_ix_masked_1;
  size_t backward_2;
  size_t depth_remaining_1;
  size_t best_len_right_1;
  size_t best_len_left_1;
  size_t node_right_1;
  size_t node_left_1;
  size_t prev_ix_2;
  uint32_t *forest_1;
  uint32_t *buckets_1;
  uint32_t key_2;
  int should_reroot_tree_1;
  size_t max_comp_len_1;
  size_t cur_ix_masked_3;
  size_t matching_bits_3;
  uint64_t x_3;
  uint8_t *s1_orig_3;
  uint64_t t_8;
  uint64_t t_7;
  size_t max_backward_1;
  size_t len_4;
  size_t cur_len_2;
  size_t prev_ix_masked_2;
  size_t backward_3;
  size_t depth_remaining_2;
  size_t best_len_right_2;
  size_t best_len_left_2;
  size_t node_right_2;
  size_t node_left_2;
  size_t prev_ix_3;
  uint32_t *forest_2;
  uint32_t *buckets_2;
  uint32_t key_3;
  int should_reroot_tree_2;
  size_t max_comp_len_2;
  size_t cur_ix_masked_4;
  size_t matching_bits_4;
  uint64_t x_4;
  uint8_t *s1_orig_4;
  uint64_t t_10;
  uint64_t t_9;
  ZopfliCostModel *in_stack_fffffffffffff308;
  MemoryManager *in_stack_fffffffffffff310;
  size_t in_stack_fffffffffffff318;
  BrotliDistanceParams *in_stack_fffffffffffff320;
  ZopfliCostModel *in_stack_fffffffffffff328;
  MemoryManager *in_stack_fffffffffffff330;
  int *piVar30;
  size_t in_stack_fffffffffffff338;
  MemoryManager *gap_00;
  uint8_t *in_stack_fffffffffffff340;
  undefined7 in_stack_fffffffffffff348;
  undefined1 in_stack_fffffffffffff34f;
  ZopfliCostModel *in_stack_fffffffffffff350;
  ZopfliCostModel *local_ca8;
  ZopfliCostModel *local_c88;
  int *local_c78;
  ZopfliCostModel *nodes_00;
  ulong local_c50;
  uint32_t *in_stack_fffffffffffff3c0;
  BrotliEncoderDictionary *in_stack_fffffffffffff3c8;
  size_t in_stack_fffffffffffff3d0;
  BrotliEncoderDictionary *in_stack_fffffffffffff3d8;
  BrotliEncoderDictionary *local_c08;
  BrotliEncoderDictionary *local_c00;
  ZopfliCostModel *local_be8;
  ZopfliCostModel *local_be0;
  int *local_bd8;
  uint local_bc4;
  size_t local_bc0;
  ulong local_bb8;
  long local_b78;
  undefined1 local_b60 [64];
  BrotliEncoderParams *in_stack_fffffffffffff4e0;
  size_t in_stack_fffffffffffff4e8;
  uint8_t *in_stack_fffffffffffff4f0;
  size_t in_stack_fffffffffffff4f8;
  size_t in_stack_fffffffffffff500;
  size_t in_stack_fffffffffffff508;
  BrotliEncoderDictionary *local_9c0;
  ZopfliCostModel *local_990;
  uint local_988 [40];
  ZopfliCostModel *local_8e8;
  ZopfliCostModel *local_8e0;
  BrotliEncoderDictionary *local_8d8;
  ulong local_8d0;
  BackwardMatch *local_8c8;
  BackwardMatch *local_8c0;
  long local_8b8;
  undefined1 *local_8b0;
  ZopfliCostModel *local_8a8;
  BrotliEncoderDictionary *local_8a0;
  ZopfliCostModel *local_898;
  float local_880 [2];
  ulong *local_878;
  BrotliEncoderDictionary *local_870;
  float local_868 [2];
  size_t local_860;
  ulong local_858;
  undefined1 *local_850;
  float local_848 [2];
  BackwardMatch *local_840;
  undefined1 *local_838;
  ZopfliCostModel *local_830;
  uint32_t *local_828;
  uint32_t *local_820;
  ZopfliCostModel *local_818;
  ulong *local_800;
  BackwardMatch *local_7f8;
  BackwardMatch *local_7f0;
  BackwardMatch *local_7e8;
  BackwardMatch *local_7e0;
  BrotliEncoderDictionary *local_7d8;
  float local_7d0 [2];
  ulong local_7c8;
  ulong local_7c0;
  int *local_7b8;
  int *in_stack_fffffffffffff850;
  int *piVar31;
  int *in_stack_fffffffffffff858;
  int *in_stack_fffffffffffff860;
  BackwardMatch *in_stack_fffffffffffff868;
  BackwardMatch *pBVar32;
  ZopfliCostModel *in_stack_fffffffffffff870;
  StartPosQueue *in_stack_fffffffffffff878;
  StartPosQueue *pSVar33;
  ZopfliNode *in_stack_fffffffffffff880;
  BrotliEncoderDictionary *local_768;
  ulong *local_760;
  ulong *local_758;
  BrotliEncoderDictionary *local_750;
  long local_710;
  BrotliEncoderDictionary *local_708;
  BrotliEncoderDictionary *local_700;
  long local_6f8;
  long local_6f0;
  ulong local_6e8;
  BackwardMatch *local_6b8;
  ulong local_640;
  ulong *local_638;
  ulong *local_630;
  char *local_628;
  long local_520;
  float local_514;
  uint *local_510;
  uint32_t *local_4f0;
  undefined8 *local_4e0;
  BackwardMatch *local_498;
  uint32_t *local_438;
  ulong *local_430;
  ulong *local_428;
  uint32_t *local_420;
  long local_378;
  ZopfliCostModel *local_370;
  ZopfliCostModel *local_368;
  long local_360;
  long local_358;
  ulong local_350;
  undefined4 *local_320;
  ulong local_2a8;
  ulong *local_2a0;
  ulong *local_298;
  char *local_290;
  long local_1a8;
  ZopfliCostModel *local_1a0;
  ZopfliCostModel *local_198;
  long local_190;
  long local_188;
  ulong local_180;
  undefined4 *local_150;
  ulong local_d8;
  ulong *local_d0;
  ulong *local_c8;
  char *local_c0;
  
  lVar4 = *(long *)(in_stack_00000008 + 0x10);
  pZVar12 = (ZopfliCostModel *)
            ((1L << ((byte)*(undefined4 *)(in_stack_00000008 + 8) & 0x3f)) - 0x10);
  uVar8 = 0x145;
  if (*(int *)(in_stack_00000008 + 4) < 0xb) {
    uVar8 = 0x96;
  }
  dst = (BackwardMatch *)BrotliAllocate(in_stack_fffffffffffff310,(size_t)in_stack_fffffffffffff308)
  ;
  local_bd8 = in_RDX;
  if (0x7f < in_RSI) {
    local_bd8 = (int *)((long)in_RDX + (in_RSI - 0x7f));
  }
  puVar13 = (ulong *)(in_stack_00000008 + 0x58);
  lVar5 = *(long *)(in_stack_00000008 + 0x60);
  iVar10 = 0;
  if (*puVar13 != 0) {
    iVar10 = 0x100;
  }
  lVar14 = (long)iVar10;
  pZVar15 = (ZopfliCostModel *)
            BrotliAllocate(in_stack_fffffffffffff310,(size_t)in_stack_fffffffffffff308);
  *(uint32_t *)&in_stack_00000020->alloc_func = 0;
  ((anon_union_4_3_cc401a1e_for_u *)((long)&in_stack_00000020->free_func + 4))->cost = 0.0;
  InitZopfliCostModel(in_stack_fffffffffffff330,in_stack_fffffffffffff328,in_stack_fffffffffffff320,
                      in_stack_fffffffffffff318);
  ZopfliCostModelSetFromLiteralCosts
            (in_stack_fffffffffffff350,CONCAT17(in_stack_fffffffffffff34f,in_stack_fffffffffffff348)
             ,in_stack_fffffffffffff340,in_stack_fffffffffffff338);
  local_b78 = 0;
  do {
    if (in_RSI <= local_b78 + 3U) {
      CleanupZopfliCostModel(in_stack_fffffffffffff310,in_stack_fffffffffffff308);
      BrotliFree(in_stack_fffffffffffff310,in_stack_fffffffffffff308);
      BrotliFree(in_stack_fffffffffffff310,in_stack_fffffffffffff308);
      sVar24 = ComputeShortestPathFromNodes(in_RSI,(ZopfliNode *)in_stack_00000020);
      return sVar24;
    }
    pZVar16 = (ZopfliCostModel *)((long)in_RDX + local_b78);
    local_be0 = pZVar12;
    if (pZVar16 < pZVar12) {
      local_be0 = pZVar16;
    }
    pZVar18 = (ZopfliCostModel *)((long)pZVar16->cost_cmd_ + lVar4);
    local_be8 = pZVar12;
    if (pZVar18 < pZVar12) {
      local_be8 = pZVar18;
    }
    local_bc4 = 0;
    if (*(int *)(in_stack_00000008 + 0x270) != 0) {
      if (pZVar16 == (ZopfliCostModel *)0x0) {
        bVar1 = 0;
      }
      else {
        bVar1 = *(byte *)((long)in_RCX->cost_cmd_ +
                         ((ulong)((long)&pZVar16[-1].field_6 + 0x1b7fU) & (ulong)in_R8));
      }
      if (pZVar16 < (ZopfliCostModel *)((long)&pZRam0000000000000000 + 2U)) {
        bVar2 = 0;
      }
      else {
        bVar2 = *(byte *)((long)in_RCX->cost_cmd_ +
                         ((ulong)((long)&pZVar16[-1].field_6 + 0x1b7eU) & (ulong)in_R8));
      }
      local_bc4 = (uint)*(byte *)(in_stack_00000008 + 0x275 +
                                 (long)(int)(uint)(*(byte *)(in_R9 + (ulong)bVar1) |
                                                  *(byte *)(in_R9 + 0x100 + (ulong)bVar2)));
    }
    puVar26 = (ulong *)(in_stack_00000018 + 0x50);
    local_880 = *(float (*) [2])(in_stack_00000008 + 0x2b8 + (long)(int)local_bc4 * 8);
    pBVar27 = (BrotliEncoderDictionary *)(in_RSI - local_b78);
    local_8b0 = (undefined1 *)((long)local_be8->cost_cmd_ + lVar5);
    local_8c8 = dst + lVar14;
    local_8a8 = local_be0;
    local_8b8 = in_stack_00000008;
    local_8d0 = (ulong)pZVar16 & (ulong)in_R8;
    local_8d8 = (BrotliEncoderDictionary *)((long)&pZRam0000000000000000 + 1);
    iVar10 = 0x40;
    if (*(int *)(in_stack_00000008 + 4) != 0xb) {
      iVar10 = 0x10;
    }
    local_8e0 = (ZopfliCostModel *)(long)iVar10;
    local_8e8 = (ZopfliCostModel *)((long)pZVar16 - (long)local_8e0);
    local_8c0 = local_8c8;
    local_990 = pZVar16;
    if (pZVar16 < local_8e0) {
      local_8e8 = (ZopfliCostModel *)0x0;
      local_8c0 = local_8c8;
    }
    while ((local_990 = (ZopfliCostModel *)((long)&local_990[-1].field_6 + 0x1b7f),
           local_8e8 < local_990 &&
           local_8d8 <= (BrotliEncoderDictionary *)((long)&pZRam0000000000000000 + 2) &&
           ((ZopfliCostModel *)((long)pZVar16 - (long)local_990) <= local_be0))) {
      uVar17 = (ulong)in_R8 & (ulong)local_990;
      if ((*(char *)((long)in_RCX->cost_cmd_ + local_8d0) ==
           *(char *)((long)in_RCX->cost_cmd_ + uVar17)) &&
         (*(char *)((long)in_RCX->cost_cmd_ + local_8d0 + 1) ==
          *(char *)((long)in_RCX->cost_cmd_ + uVar17 + 1))) {
        puVar25 = (ulong *)((long)in_RCX->cost_cmd_ + uVar17);
        local_760 = (ulong *)((long)in_RCX->cost_cmd_ + local_8d0);
        local_768 = pBVar27;
        local_758 = puVar25;
LAB_0240e2ea:
        if (local_768 < (BrotliEncoderDictionary *)0x8) {
          while( true ) {
            bVar28 = false;
            if (local_768 != (BrotliEncoderDictionary *)0x0) {
              bVar28 = (char)*local_758 == (char)*local_760;
            }
            if (!bVar28) break;
            local_768 = (BrotliEncoderDictionary *)((long)&local_768[-1].words_instance_ + 7);
            local_760 = (ulong *)((long)local_760 + 1);
            local_758 = (ulong *)((long)local_758 + 1);
          }
          local_750 = (BrotliEncoderDictionary *)((long)local_758 - (long)puVar25);
        }
        else {
          uVar17 = *local_760 ^ *local_758;
          local_760 = local_760 + 1;
          if (uVar17 == 0) goto LAB_0240e3bc;
          iVar10 = 0;
          for (; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
            iVar10 = iVar10 + 1;
          }
          in_stack_fffffffffffff880 = (ZopfliNode *)(long)iVar10;
          local_750 = (BrotliEncoderDictionary *)
                      ((long)local_758 + (((ulong)in_stack_fffffffffffff880 >> 3) - (long)puVar25));
        }
        if (local_8d8 < local_750) {
          local_8d8 = local_750;
          local_8c0->distance = (uint32_t)(ZopfliCostModel *)((long)pZVar16 - (long)local_990);
          local_8c0->length_and_code = (uint32_t)((long)local_750 << 5);
          local_8c0 = local_8c0 + 1;
        }
      }
    }
    local_ca8 = in_stack_fffffffffffff350;
    local_8a0 = pBVar27;
    local_898 = pZVar16;
    local_878 = puVar26;
    local_c78 = in_stack_fffffffffffff858;
    if (local_8d8 < pBVar27) {
      local_6b8 = local_8c0;
      uVar17 = (ulong)pZVar16 & (ulong)in_R8;
      local_c00 = pBVar27;
      if ((BrotliEncoderDictionary *)0x7f < pBVar27) {
        local_c00 = (BrotliEncoderDictionary *)0x80;
      }
      bVar28 = (BrotliEncoderDictionary *)0x7f < pBVar27;
      uVar9 = HashBytesH10((uint8_t *)((long)in_RCX->cost_cmd_ + uVar17));
      lVar23 = *(long *)(in_stack_00000018 + 0x68);
      uVar3 = *(uint *)(*(long *)(in_stack_00000018 + 0x58) + (ulong)uVar9 * 4);
      local_6f0 = ((ulong)pZVar16 & *puVar26) << 1;
      local_6f8 = ((ulong)pZVar16 & *puVar26) * 2 + 1;
      local_700 = (BrotliEncoderDictionary *)0x0;
      local_708 = (BrotliEncoderDictionary *)0x0;
      if (bVar28) {
        *(int *)(*(long *)(in_stack_00000018 + 0x58) + (ulong)uVar9 * 4) = (int)pZVar16;
      }
      local_710 = 0x40;
      while( true ) {
        local_6e8 = (ulong)uVar3;
        pZVar18 = (ZopfliCostModel *)((long)pZVar16 - local_6e8);
        if (((pZVar18 == (ZopfliCostModel *)0x0) || (local_be0 < pZVar18)) || (local_710 == 0))
        break;
        if (local_700 < local_708) {
          local_c08 = local_700;
        }
        else {
          local_c08 = local_708;
        }
        puVar25 = (ulong *)((uint8_t *)((long)&local_c08->words + uVar17) + (long)in_RCX->cost_cmd_)
        ;
        local_638 = (ulong *)((uint8_t *)((long)&local_c08->words + (local_6e8 & (ulong)in_R8)) +
                             (long)in_RCX->cost_cmd_);
        local_640 = (long)pBVar27 - (long)local_c08;
        local_630 = puVar25;
LAB_0240e91e:
        if (local_640 < 8) {
          while( true ) {
            bVar29 = false;
            if (local_640 != 0) {
              bVar29 = (char)*local_630 == (char)*local_638;
            }
            if (!bVar29) break;
            local_640 = local_640 - 1;
            local_638 = (ulong *)((long)local_638 + 1);
            local_630 = (ulong *)((long)local_630 + 1);
          }
          local_628 = (char *)((long)local_630 - (long)puVar25);
        }
        else {
          uVar20 = *local_638 ^ *local_630;
          local_638 = local_638 + 1;
          if (uVar20 == 0) goto LAB_0240e9f0;
          iVar10 = 0;
          for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
            iVar10 = iVar10 + 1;
          }
          local_628 = (char *)((long)local_630 + (((ulong)(long)iVar10 >> 3) - (long)puVar25));
        }
        pBVar19 = (BrotliEncoderDictionary *)((long)&local_c08->words + (long)local_628);
        if ((local_6b8 != (BackwardMatch *)0x0) && (local_8d8 < pBVar19)) {
          local_6b8->distance = (uint32_t)pZVar18;
          local_6b8->length_and_code = (int)pBVar19 * 0x20;
          local_8d8 = pBVar19;
          local_6b8 = local_6b8 + 1;
        }
        if (local_c00 <= pBVar19) {
          if (bVar28) {
            *(undefined4 *)(lVar23 + local_6f0 * 4) =
                 *(undefined4 *)(lVar23 + (local_6e8 & *puVar26) * 8);
            *(undefined4 *)(lVar23 + local_6f8 * 4) =
                 *(undefined4 *)(lVar23 + 4 + (local_6e8 & *puVar26) * 8);
          }
          goto LAB_0240edcd;
        }
        if (((uint8_t *)((long)&pBVar19->words + (local_6e8 & (ulong)in_R8)))
            [(long)in_RCX->cost_cmd_] <
            ((uint8_t *)((long)&pBVar19->words + uVar17))[(long)in_RCX->cost_cmd_]) {
          if (bVar28) {
            *(uint *)(lVar23 + local_6f0 * 4) = uVar3;
          }
          local_6f0 = (local_6e8 & *puVar26) * 2 + 1;
          uVar3 = *(uint *)(lVar23 + local_6f0 * 4);
          local_700 = pBVar19;
        }
        else {
          if (bVar28) {
            *(uint *)(lVar23 + local_6f8 * 4) = uVar3;
          }
          local_6f8 = (local_6e8 & *puVar26) * 2;
          uVar3 = *(uint *)(lVar23 + (local_6e8 & *puVar26) * 8);
          local_708 = pBVar19;
        }
        local_710 = local_710 + -1;
      }
      if (bVar28) {
        *(undefined4 *)(lVar23 + local_6f0 * 4) = *(undefined4 *)(in_stack_00000018 + 0x60);
        *(undefined4 *)(lVar23 + local_6f8 * 4) = *(undefined4 *)(in_stack_00000018 + 0x60);
      }
LAB_0240edcd:
      local_8c0 = local_6b8;
      local_ca8 = in_stack_fffffffffffff350;
      local_c78 = in_stack_fffffffffffff858;
    }
    for (local_990 = (ZopfliCostModel *)0x0; local_990 < 0x26;
        local_990 = (ZopfliCostModel *)((long)local_990 + 1)) {
      local_988[(long)local_990] = 0xfffffff;
    }
    local_7d8 = (BrotliEncoderDictionary *)((long)&local_8d8->words + 1);
    local_7d0[0] = 5.60519e-45;
    local_7d0[1] = 0.0;
    local_9c0 = local_7d8;
    if (local_7d8 <= (BrotliEncoderDictionary *)((long)&pZRam0000000000000000 + 3)) {
      local_9c0 = (BrotliEncoderDictionary *)((long)&pZRam0000000000000000 + 4);
    }
    iVar10 = BrotliFindAllStaticDictionaryMatches
                       (local_9c0,(uint8_t *)in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0,
                        (size_t)in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0);
    if (iVar10 != 0) {
      local_868[0] = 5.1848e-44;
      local_868[1] = 0.0;
      local_870 = local_8a0;
      in_stack_fffffffffffff3d8 = local_8a0;
      if ((BrotliEncoderDictionary *)0x25 < local_8a0) {
        in_stack_fffffffffffff3d8 = (BrotliEncoderDictionary *)0x25;
      }
      for (; pBVar32 = local_8c0, local_9c0 <= in_stack_fffffffffffff3d8;
          local_9c0 = (BrotliEncoderDictionary *)((long)&local_9c0->words + 1)) {
        uVar3 = local_988[(long)local_9c0];
        if ((uVar3 < 0xfffffff) &&
           (local_8b0 + (ulong)(uVar3 >> 5) + 1 <= *(undefined1 **)(local_8b8 + 0x48))) {
          local_8c0 = local_8c0 + 1;
          in_stack_fffffffffffff3c8 = (BrotliEncoderDictionary *)(ulong)(uVar3 & 0x1f);
          pBVar32->distance = (uint32_t)(local_8b0 + (ulong)(uVar3 >> 5) + 1);
          in_stack_fffffffffffff3d0 = (long)local_9c0 << 5;
          if (local_9c0 == in_stack_fffffffffffff3c8) {
            in_stack_fffffffffffff3c8 = (BrotliEncoderDictionary *)0x0;
          }
          pBVar32->length_and_code =
               (uint)in_stack_fffffffffffff3d0 | (uint)in_stack_fffffffffffff3c8;
        }
      }
    }
    local_bc0 = (long)local_8c0 - (long)local_8c8 >> 3;
    if (*puVar13 != 0) {
      local_828 = (uint32_t *)(in_RSI - local_b78);
      local_838 = *(undefined1 **)(in_stack_00000008 + 0x48);
      local_840 = dst + lVar14 + -0x40;
      local_820 = (uint32_t *)((long)&pZRam0000000000000000 + 3);
      local_830 = local_be8;
      local_848[0] = 8.96831e-44;
      local_848[1] = 0.0;
      local_850 = (undefined1 *)((long)local_be8->cost_cmd_ + *(long *)(in_stack_00000008 + 0x60));
      local_860 = 0;
      for (local_858 = 0; local_858 < *puVar13; local_858 = local_858 + 1) {
        piVar30 = *(int **)(in_stack_00000008 + 0x68 + local_858 * 8);
        lVar23 = *(long *)(in_stack_00000008 + 0x168 + local_858 * 8);
        uVar3 = piVar30[2];
        lVar6 = (ulong)(uint)(1 << ((byte)piVar30[5] & 0x1f)) * 4 + 0x18;
        lVar7 = (ulong)(uint)(1 << ((byte)piVar30[4] & 0x1f)) * 2 + lVar6;
        uVar17 = (ulong)pZVar16 & (ulong)in_R8;
        local_4f0 = local_820;
        uVar20 = (*(ulong *)((long)in_RCX->cost_cmd_ + uVar17) &
                 0xffffffffffffffffU >> (0x40U - (char)piVar30[3] & 0x3f)) * 0x1fe35a7bd3579bd3 >>
                 (0x40 - (byte)piVar30[4] & 0x3f);
        uVar11 = (uint)*(ushort *)((long)piVar30 + (uVar20 & 0xffffffff) * 2 + lVar6);
        local_510 = (uint *)((long)piVar30 +
                            (ulong)(piVar30[(ulong)((uint)uVar20 &
                                                   0xffffffffU >> (0x20 - (byte)piVar30[5] & 0x1f))
                                            + 6] + uVar11) * 4 + lVar7);
        local_514 = (float)(uint)(uVar11 == 0xffff);
        local_520 = 0;
        local_4e0 = (undefined8 *)((long)piVar30 + (ulong)(uint)piVar30[1] * 4 + lVar7);
        local_498 = local_840 + local_860;
        if (*piVar30 != -0x21431220) {
          local_4e0 = (undefined8 *)*local_4e0;
        }
        do {
          do {
            do {
              if (local_514 != 0.0) goto LAB_0240f95a;
              uVar11 = *local_510;
              local_510 = local_510 + 1;
              uVar20 = (ulong)(uVar11 & 0x7fffffff);
              local_514 = (float)(uVar11 & 0x80000000);
              in_stack_fffffffffffff3c0 = (uint32_t *)(uVar3 - uVar20);
              if (local_828 < in_stack_fffffffffffff3c0) {
                in_stack_fffffffffffff3c0 = local_828;
              }
            } while ((((local_838 < local_850 + (-uVar20 - lVar23)) ||
                      (in_R8 < (BackwardMatch *)(uVar17 + (long)local_4f0))) ||
                     (in_stack_fffffffffffff3c0 <= local_4f0)) ||
                    (*(char *)((long)local_4f0 + (long)in_RCX->cost_cmd_ + uVar17) !=
                     *(char *)((long)local_4e0 + (long)(uVar20 + (long)local_4f0))));
            puVar26 = (ulong *)((long)local_4e0 + uVar20);
            local_430 = (ulong *)((long)in_RCX->cost_cmd_ + uVar17);
            local_438 = in_stack_fffffffffffff3c0;
            local_428 = puVar26;
LAB_0240f6e9:
            if (local_438 < (uint32_t *)0x8) {
              while( true ) {
                bVar28 = false;
                if (local_438 != (uint32_t *)0x0) {
                  bVar28 = (char)*local_428 == (char)*local_430;
                }
                if (!bVar28) break;
                local_438 = (uint32_t *)((long)local_438 + -1);
                local_430 = (ulong *)((long)local_430 + 1);
                local_428 = (ulong *)((long)local_428 + 1);
              }
              local_420 = (uint32_t *)((long)local_428 - (long)puVar26);
            }
            else {
              uVar21 = *local_430 ^ *local_428;
              local_430 = local_430 + 1;
              if (uVar21 == 0) goto LAB_0240f7bb;
              iVar10 = 0;
              for (; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
                iVar10 = iVar10 + 1;
              }
              local_420 = (uint32_t *)
                          ((long)local_428 + (((ulong)(long)iVar10 >> 3) - (long)puVar26));
            }
          } while (local_420 <= local_4f0);
          local_4f0 = local_420;
          local_498->distance = (uint32_t)(local_850 + (-uVar20 - lVar23));
          local_498->length_and_code = (uint32_t)((long)local_420 << 5);
          local_520 = local_520 + 1;
          local_498 = local_498 + 1;
        } while (local_520 != 0x40 - local_860);
LAB_0240f95a:
        local_860 = local_520 + local_860;
        if (local_860 == 0x40) break;
        if (local_860 != 0) {
          local_7f8 = local_840 + (local_860 - 1);
          local_820 = (uint32_t *)(ulong)(local_7f8->length_and_code >> 5);
        }
      }
      sVar24 = local_860;
      local_818 = pZVar16;
      local_800 = puVar13;
      MergeMatches(dst,dst + lVar14 + -0x40,local_860,dst + lVar14,local_bc0);
      local_bc0 = sVar24 + local_bc0;
    }
    if ((local_bc0 != 0) &&
       (local_7e0 = dst + (local_bc0 - 1), uVar8 < local_7e0->length_and_code >> 5)) {
      *dst = dst[local_bc0 - 1];
      local_bc0 = 1;
    }
    piVar30 = (int *)local_b60;
    in_stack_fffffffffffff308 = pZVar12;
    in_stack_fffffffffffff310 = in_stack_00000010;
    pZVar18 = pZVar15;
    gap_00 = in_stack_00000020;
    local_bb8 = UpdateNodes(in_stack_fffffffffffff508,in_stack_fffffffffffff500,
                            in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0,
                            in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,
                            (size_t)in_stack_fffffffffffff850,local_c78,
                            (size_t)in_stack_fffffffffffff860,in_stack_fffffffffffff868,
                            in_stack_fffffffffffff870,in_stack_fffffffffffff878,
                            in_stack_fffffffffffff880);
    if (local_bb8 < 0x4000) {
      local_bb8 = 0;
    }
    if ((local_bc0 == 1) && (local_7e8 = dst, uVar8 < dst->length_and_code >> 5)) {
      local_7c0 = (ulong)(dst->length_and_code >> 5);
      local_7c8 = local_bb8;
      local_c50 = local_7c0;
      if (local_7c0 <= local_bb8) {
        local_c50 = local_bb8;
      }
      local_bb8 = local_c50;
      local_7f0 = dst;
    }
    if (1 < local_bb8) {
      queue_00 = (StartPosQueue *)(in_stack_00000018 + 0x50);
      local_7b8 = (int *)((long)pZVar16->cost_cmd_ + 1);
      local_c78 = (int *)((long)pZVar16->cost_cmd_ + local_bb8);
      if (local_bd8 <= local_c78) {
        local_c78 = local_bd8;
      }
      in_stack_fffffffffffff850 = local_7b8;
      if (pZVar16->cost_cmd_ + 0x10 <= local_c78) {
        in_stack_fffffffffffff850 = (int *)((long)local_c78 + -0x3f);
      }
      nodes_00 = in_RCX;
      in_stack_fffffffffffff860 = local_7b8;
      in_stack_fffffffffffff868 = in_R8;
      in_stack_fffffffffffff870 = in_RCX;
      in_stack_fffffffffffff878 = queue_00;
      if ((int *)((long)pZVar16->cost_cmd_ + 0x201U) <= in_stack_fffffffffffff850) {
        for (; piVar31 = local_7b8, local_7b8 < in_stack_fffffffffffff850; local_7b8 = local_7b8 + 2
            ) {
          sVar24 = in_stack_fffffffffffff878->q_[0].pos;
          local_320 = (undefined4 *)0x0;
          uVar17 = (ulong)local_7b8 & (ulong)in_stack_fffffffffffff868;
          pBVar32 = in_stack_fffffffffffff868;
          pZVar16 = in_stack_fffffffffffff870;
          pSVar33 = in_stack_fffffffffffff878;
          uVar9 = HashBytesH10((uint8_t *)((long)in_stack_fffffffffffff870->cost_cmd_ + uVar17));
          lVar23 = *(long *)in_stack_fffffffffffff878->q_[0].distance_cache;
          lVar6 = *(long *)&in_stack_fffffffffffff878->q_[0].costdiff;
          uVar3 = *(uint *)(lVar23 + (ulong)uVar9 * 4);
          local_358 = ((ulong)piVar31 & in_stack_fffffffffffff878->q_[0].pos) << 1;
          local_360 = ((ulong)piVar31 & in_stack_fffffffffffff878->q_[0].pos) * 2 + 1;
          local_368 = (ZopfliCostModel *)0x0;
          local_370 = (ZopfliCostModel *)0x0;
          *(int *)(lVar23 + (ulong)uVar9 * 4) = (int)piVar31;
          local_378 = 0x40;
          while( true ) {
            local_350 = (ulong)uVar3;
            uVar20 = (long)piVar31 - local_350;
            if (((uVar20 == 0) || (sVar24 - 0xf < uVar20)) || (local_378 == 0)) break;
            if (local_368 < local_370) {
              local_c88 = local_368;
            }
            else {
              local_c88 = local_370;
            }
            puVar26 = (ulong *)((long)in_stack_fffffffffffff870->cost_cmd_ +
                               (long)((long)local_c88->cost_cmd_ + uVar17));
            local_2a0 = (ulong *)((long)in_stack_fffffffffffff870->cost_cmd_ +
                                 (long)((long)local_c88->cost_cmd_ +
                                       (local_350 & (ulong)in_stack_fffffffffffff868)));
            local_2a8 = 0x80 - (long)local_c88;
            local_298 = puVar26;
LAB_024101bb:
            if (local_2a8 < 8) {
              while( true ) {
                bVar28 = false;
                if (local_2a8 != 0) {
                  bVar28 = (char)*local_298 == (char)*local_2a0;
                }
                if (!bVar28) break;
                local_2a8 = local_2a8 - 1;
                local_2a0 = (ulong *)((long)local_2a0 + 1);
                local_298 = (ulong *)((long)local_298 + 1);
              }
              local_290 = (char *)((long)local_298 - (long)puVar26);
            }
            else {
              uVar21 = *local_2a0 ^ *local_298;
              local_2a0 = local_2a0 + 1;
              if (uVar21 == 0) goto LAB_0241028d;
              iVar10 = 0;
              for (; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
                iVar10 = iVar10 + 1;
              }
              local_290 = (char *)((long)local_298 + (((ulong)(long)iVar10 >> 3) - (long)puVar26));
            }
            pZVar22 = (ZopfliCostModel *)((long)local_c88->cost_cmd_ + (long)local_290);
            if ((local_320 != (undefined4 *)0x0) && (pZRam0000000000000000 < pZVar22)) {
              pZRam0000000000000000 = pZVar22;
              *local_320 = (int)uVar20;
              local_320[1] = (int)pZVar22 * 0x20;
              local_320 = local_320 + 2;
            }
            if ((ZopfliCostModel *)0x7f < pZVar22) {
              *(undefined4 *)(lVar6 + local_358 * 4) =
                   *(undefined4 *)(lVar6 + (local_350 & in_stack_fffffffffffff878->q_[0].pos) * 8);
              *(undefined4 *)(lVar6 + local_360 * 4) =
                   *(undefined4 *)
                    (lVar6 + 4 + (local_350 & in_stack_fffffffffffff878->q_[0].pos) * 8);
              goto LAB_0241065b;
            }
            if (*(byte *)((long)in_stack_fffffffffffff870->cost_cmd_ +
                         (long)((long)pZVar22->cost_cmd_ +
                               (local_350 & (ulong)in_stack_fffffffffffff868))) <
                *(byte *)((long)in_stack_fffffffffffff870->cost_cmd_ +
                         (long)((long)pZVar22->cost_cmd_ + uVar17))) {
              *(uint *)(lVar6 + local_358 * 4) = uVar3;
              local_358 = (local_350 & in_stack_fffffffffffff878->q_[0].pos) * 2 + 1;
              uVar3 = *(uint *)(lVar6 + local_358 * 4);
              local_368 = pZVar22;
            }
            else {
              *(uint *)(lVar6 + local_360 * 4) = uVar3;
              local_350 = local_350 & in_stack_fffffffffffff878->q_[0].pos;
              local_360 = local_350 * 2;
              uVar3 = *(uint *)(lVar6 + local_350 * 8);
              local_370 = pZVar22;
            }
            local_378 = local_378 + -1;
          }
          *(int *)(lVar6 + local_358 * 4) = in_stack_fffffffffffff878->q_[0].distance_cache[2];
          *(int *)(lVar6 + local_360 * 4) = in_stack_fffffffffffff878->q_[0].distance_cache[2];
LAB_0241065b:
          in_stack_fffffffffffff868 = pBVar32;
          in_stack_fffffffffffff870 = pZVar16;
          in_stack_fffffffffffff878 = pSVar33;
        }
      }
      while (in_stack_fffffffffffff850 < local_c78) {
        sVar24 = in_stack_fffffffffffff878->q_[0].pos;
        local_150 = (undefined4 *)0x0;
        uVar17 = (ulong)in_stack_fffffffffffff850 & (ulong)in_stack_fffffffffffff868;
        piVar31 = in_stack_fffffffffffff850;
        pBVar32 = in_stack_fffffffffffff868;
        pZVar16 = in_stack_fffffffffffff870;
        pSVar33 = in_stack_fffffffffffff878;
        uVar9 = HashBytesH10((uint8_t *)((long)in_stack_fffffffffffff870->cost_cmd_ + uVar17));
        lVar23 = *(long *)in_stack_fffffffffffff878->q_[0].distance_cache;
        lVar6 = *(long *)&in_stack_fffffffffffff878->q_[0].costdiff;
        uVar3 = *(uint *)(lVar23 + (ulong)uVar9 * 4);
        local_188 = ((ulong)in_stack_fffffffffffff850 & in_stack_fffffffffffff878->q_[0].pos) << 1;
        local_190 = ((ulong)in_stack_fffffffffffff850 & in_stack_fffffffffffff878->q_[0].pos) * 2 +
                    1;
        local_198 = (ZopfliCostModel *)0x0;
        local_1a0 = (ZopfliCostModel *)0x0;
        *(int *)(lVar23 + (ulong)uVar9 * 4) = (int)in_stack_fffffffffffff850;
        local_1a8 = 0x40;
        while( true ) {
          local_180 = (ulong)uVar3;
          uVar20 = (long)in_stack_fffffffffffff850 - local_180;
          if (((uVar20 == 0) || (sVar24 - 0xf < uVar20)) || (local_1a8 == 0)) break;
          if (local_198 < local_1a0) {
            local_ca8 = local_198;
          }
          else {
            local_ca8 = local_1a0;
          }
          puVar26 = (ulong *)((long)in_stack_fffffffffffff870->cost_cmd_ +
                             (long)((long)local_ca8->cost_cmd_ + uVar17));
          local_d0 = (ulong *)((long)in_stack_fffffffffffff870->cost_cmd_ +
                              (long)((long)local_ca8->cost_cmd_ +
                                    (local_180 & (ulong)in_stack_fffffffffffff868)));
          local_d8 = 0x80 - (long)local_ca8;
          local_c8 = puVar26;
LAB_02410a8d:
          if (local_d8 < 8) {
            while( true ) {
              bVar28 = false;
              if (local_d8 != 0) {
                bVar28 = (char)*local_c8 == (char)*local_d0;
              }
              if (!bVar28) break;
              local_d8 = local_d8 - 1;
              local_d0 = (ulong *)((long)local_d0 + 1);
              local_c8 = (ulong *)((long)local_c8 + 1);
            }
            local_c0 = (char *)((long)local_c8 - (long)puVar26);
            in_stack_fffffffffffff34f = 0;
          }
          else {
            uVar21 = *local_d0 ^ *local_c8;
            local_d0 = local_d0 + 1;
            if (uVar21 == 0) goto LAB_02410b5f;
            iVar10 = 0;
            for (; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
              iVar10 = iVar10 + 1;
            }
            local_c0 = (char *)((long)local_c8 + (((ulong)(long)iVar10 >> 3) - (long)puVar26));
          }
          pZVar22 = (ZopfliCostModel *)((long)local_ca8->cost_cmd_ + (long)local_c0);
          if ((local_150 != (undefined4 *)0x0) && (pZRam0000000000000000 < pZVar22)) {
            pZRam0000000000000000 = pZVar22;
            *local_150 = (int)uVar20;
            local_150[1] = (int)pZVar22 * 0x20;
            local_150 = local_150 + 2;
          }
          if ((ZopfliCostModel *)0x7f < pZVar22) {
            *(undefined4 *)(lVar6 + local_188 * 4) =
                 *(undefined4 *)(lVar6 + (local_180 & in_stack_fffffffffffff878->q_[0].pos) * 8);
            *(undefined4 *)(lVar6 + local_190 * 4) =
                 *(undefined4 *)(lVar6 + 4 + (local_180 & in_stack_fffffffffffff878->q_[0].pos) * 8)
            ;
            goto LAB_02410f2d;
          }
          if (*(byte *)((long)in_stack_fffffffffffff870->cost_cmd_ +
                       (long)((long)pZVar22->cost_cmd_ +
                             (local_180 & (ulong)in_stack_fffffffffffff868))) <
              *(byte *)((long)in_stack_fffffffffffff870->cost_cmd_ +
                       (long)((long)pZVar22->cost_cmd_ + uVar17))) {
            *(uint *)(lVar6 + local_188 * 4) = uVar3;
            local_188 = (local_180 & in_stack_fffffffffffff878->q_[0].pos) * 2 + 1;
            uVar3 = *(uint *)(lVar6 + local_188 * 4);
            local_198 = pZVar22;
          }
          else {
            *(uint *)(lVar6 + local_190 * 4) = uVar3;
            local_180 = local_180 & in_stack_fffffffffffff878->q_[0].pos;
            local_190 = local_180 * 2;
            uVar3 = *(uint *)(lVar6 + local_180 * 8);
            local_1a0 = pZVar22;
          }
          local_1a8 = local_1a8 + -1;
        }
        *(int *)(lVar6 + local_188 * 4) = in_stack_fffffffffffff878->q_[0].distance_cache[2];
        *(int *)(lVar6 + local_190 * 4) = in_stack_fffffffffffff878->q_[0].distance_cache[2];
LAB_02410f2d:
        in_stack_fffffffffffff868 = pBVar32;
        in_stack_fffffffffffff870 = pZVar16;
        in_stack_fffffffffffff878 = pSVar33;
        in_stack_fffffffffffff850 = (int *)((long)piVar31 + 1);
      }
      while ((local_bb8 = local_bb8 - 1, local_bb8 != 0 &&
             (lVar23 = local_b78 + 1, uVar17 = local_b78 + 4, local_b78 = lVar23, uVar17 < in_RSI)))
      {
        in_stack_fffffffffffff308 = (ZopfliCostModel *)local_b60;
        in_stack_fffffffffffff310 = in_stack_00000020;
        EvaluateNode((size_t)local_ca8,CONCAT17(in_stack_fffffffffffff34f,in_stack_fffffffffffff348)
                     ,(size_t)in_stack_fffffffffffff340,(size_t)gap_00,piVar30,pZVar18,queue_00,
                     (ZopfliNode *)nodes_00);
      }
    }
    local_b78 = local_b78 + 1;
    in_stack_fffffffffffff350 = local_ca8;
    in_stack_fffffffffffff858 = local_c78;
  } while( true );
LAB_0240e9f0:
  local_630 = local_630 + 1;
  local_640 = local_640 - 8;
  goto LAB_0240e91e;
LAB_0240f7bb:
  local_428 = local_428 + 1;
  local_438 = local_438 + -2;
  goto LAB_0240f6e9;
LAB_0241028d:
  local_298 = local_298 + 1;
  local_2a8 = local_2a8 - 8;
  goto LAB_024101bb;
LAB_02410b5f:
  local_c8 = local_c8 + 1;
  local_d8 = local_d8 - 8;
  goto LAB_02410a8d;
LAB_0240e3bc:
  local_758 = local_758 + 1;
  local_768 = (BrotliEncoderDictionary *)&local_768[-1].words_instance_;
  goto LAB_0240e2ea;
}

Assistant:

size_t duckdb_brotli::BrotliZopfliComputeShortestPath(MemoryManager* m, size_t num_bytes,
    size_t position, const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    const int* dist_cache, Hasher* hasher, ZopfliNode* nodes) {
  const size_t stream_offset = params->stream_offset;
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t max_zopfli_len = MaxZopfliLen(params);
  StartPosQueue queue;
  BackwardMatch* BROTLI_RESTRICT matches =
      BROTLI_ALLOC(m, BackwardMatch, 2 * (MAX_NUM_MATCHES_H10 + 64));
  const size_t store_end = num_bytes >= StoreLookaheadH10() ?
      position + num_bytes - StoreLookaheadH10() + 1 : position;
  size_t i;
  const CompoundDictionary* addon = &params->dictionary.compound;
  size_t gap = addon->total_size;
  size_t lz_matches_offset =
      (addon->num_chunks != 0) ? (MAX_NUM_MATCHES_H10 + 128) : 0;
  ZopfliCostModel* model = BROTLI_ALLOC(m, ZopfliCostModel, 1);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(model) || BROTLI_IS_NULL(matches)) {
    return 0;
  }
  nodes[0].length = 0;
  nodes[0].u.cost = 0;
  InitZopfliCostModel(m, model, &params->dist, num_bytes);
  if (BROTLI_IS_OOM(m)) return 0;
  ZopfliCostModelSetFromLiteralCosts(
      model, position, ringbuffer, ringbuffer_mask);
  InitStartPosQueue(&queue);
  for (i = 0; i + HashTypeLengthH10() - 1 < num_bytes; i++) {
    const size_t pos = position + i;
    const size_t max_distance = BROTLI_MIN(size_t, pos, max_backward_limit);
    const size_t dictionary_start = BROTLI_MIN(size_t,
        pos + stream_offset, max_backward_limit);
    size_t skip;
    size_t num_matches;
    int dict_id = 0;
    if (params->dictionary.contextual.context_based) {
      uint8_t p1 = pos >= 1 ?
          ringbuffer[(size_t)(pos - 1) & ringbuffer_mask] : 0;
      uint8_t p2 = pos >= 2 ?
          ringbuffer[(size_t)(pos - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    num_matches = FindAllMatchesH10(&hasher->privat._H10,
        params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, pos, num_bytes - i, max_distance,
        dictionary_start + gap, params, &matches[lz_matches_offset]);
    if (addon->num_chunks != 0) {
      size_t cd_matches = LookupAllCompoundDictionaryMatches(addon,
          ringbuffer, ringbuffer_mask, pos, 3, num_bytes - i,
          dictionary_start, params->dist.max_distance,
          &matches[lz_matches_offset - 64], 64);
      MergeMatches(matches, &matches[lz_matches_offset - 64], cd_matches,
          &matches[lz_matches_offset], num_matches);
      num_matches += cd_matches;
    }
    if (num_matches > 0 &&
        BackwardMatchLength(&matches[num_matches - 1]) > max_zopfli_len) {
      matches[0] = matches[num_matches - 1];
      num_matches = 1;
    }
    skip = UpdateNodes(num_bytes, position, i, ringbuffer, ringbuffer_mask,
        params, max_backward_limit, dist_cache, num_matches, matches, model,
        &queue, nodes);
    if (skip < BROTLI_LONG_COPY_QUICK_STEP) skip = 0;
    if (num_matches == 1 && BackwardMatchLength(&matches[0]) > max_zopfli_len) {
      skip = BROTLI_MAX(size_t, BackwardMatchLength(&matches[0]), skip);
    }
    if (skip > 1) {
      /* Add the tail of the copy to the hasher. */
      StoreRangeH10(&hasher->privat._H10,
          ringbuffer, ringbuffer_mask, pos + 1, BROTLI_MIN(
          size_t, pos + skip, store_end));
      skip--;
      while (skip) {
        i++;
        if (i + HashTypeLengthH10() - 1 >= num_bytes) break;
        EvaluateNode(position + stream_offset, i, max_backward_limit, gap,
            dist_cache, model, &queue, nodes);
        skip--;
      }
    }
  }
  CleanupZopfliCostModel(m, model);
  BROTLI_FREE(m, model);
  BROTLI_FREE(m, matches);
  return ComputeShortestPathFromNodes(num_bytes, nodes);
}